

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O0

void __thiscall
Js::DataView::DataView
          (DataView *this,ArrayBufferBase *arrayBuffer,uint32 byteoffset,uint32 mappedLength,
          DynamicType *type)

{
  int iVar1;
  undefined4 extraout_var;
  DynamicType *type_local;
  uint32 mappedLength_local;
  uint32 byteoffset_local;
  ArrayBufferBase *arrayBuffer_local;
  DataView *this_local;
  
  ArrayBufferParent::ArrayBufferParent(&this->super_ArrayBufferParent,type,mappedLength,arrayBuffer)
  ;
  (this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01dfea48;
  this->byteOffset = byteoffset;
  Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierPtr(&this->buffer);
  iVar1 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
  Memory::WriteBarrierPtr<unsigned_char>::operator=
            (&this->buffer,(uchar *)(CONCAT44(extraout_var,iVar1) + (ulong)byteoffset));
  return;
}

Assistant:

DataView::DataView(ArrayBufferBase* arrayBuffer, uint32 byteoffset, uint32 mappedLength, DynamicType* type)
        : ArrayBufferParent(type, mappedLength, arrayBuffer),
          byteOffset(byteoffset)
    {
        buffer = arrayBuffer->GetBuffer() + byteoffset;
    }